

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateFile
               (FileDescriptor *file,bool is_descriptor,GeneratorContext *generator_context)

{
  int i;
  long lVar1;
  long lVar2;
  
  GenerateMetadataFile(file,is_descriptor,generator_context);
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < *(int *)(file + 0x2c); lVar1 = lVar1 + 1) {
    GenerateMessageFile(file,(Descriptor *)(*(long *)(file + 0x68) + lVar2),is_descriptor,
                        generator_context);
    lVar2 = lVar2 + 0x90;
  }
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < *(int *)(file + 0x30); lVar1 = lVar1 + 1) {
    GenerateEnumFile(file,(EnumDescriptor *)(*(long *)(file + 0x70) + lVar2),is_descriptor,
                     generator_context);
    lVar2 = lVar2 + 0x50;
  }
  if (*(char *)(*(long *)(file + 0x88) + 0x9e) == '\x01') {
    lVar2 = 0;
    for (lVar1 = 0; lVar1 < *(int *)(file + 0x34); lVar1 = lVar1 + 1) {
      GenerateServiceFile(file,(ServiceDescriptor *)(*(long *)(file + 0x78) + lVar2),is_descriptor,
                          generator_context);
      lVar2 = lVar2 + 0x30;
    }
  }
  return;
}

Assistant:

void GenerateFile(const FileDescriptor* file, bool is_descriptor,
                  GeneratorContext* generator_context) {
  GenerateMetadataFile(file, is_descriptor, generator_context);
  for (int i = 0; i < file->message_type_count(); i++) {
    GenerateMessageFile(file, file->message_type(i), is_descriptor,
                        generator_context);
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    GenerateEnumFile(file, file->enum_type(i), is_descriptor,
                     generator_context);
  }
  if (file->options().php_generic_services()) {
    for (int i = 0; i < file->service_count(); i++) {
      GenerateServiceFile(file, file->service(i), is_descriptor,
                       generator_context);
    }
  }
}